

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg-buffer.c
# Opt level: O0

void msgbuf_drain(msgbuf *msgbuf,size_t n)

{
  long in_RSI;
  undefined8 *in_RDI;
  bool bVar1;
  ibuf *next;
  ibuf *buf;
  undefined7 in_stack_ffffffffffffffd8;
  ibuf *msgbuf_00;
  ibuf *local_18;
  long local_10;
  
  local_18 = (ibuf *)*in_RDI;
  local_10 = in_RSI;
  while (bVar1 = local_10 != 0, local_18 != (ibuf *)0x0 && bVar1) {
    msgbuf_00 = (local_18->entry).tqe_next;
    if (local_18->rpos + local_10 < local_18->wpos) {
      local_18->rpos = local_18->rpos + local_10;
      local_10 = 0;
      local_18 = msgbuf_00;
    }
    else {
      local_10 = local_10 - (local_18->wpos - local_18->rpos);
      ibuf_dequeue((msgbuf *)msgbuf_00,
                   (ibuf *)CONCAT17(local_18 != (ibuf *)0x0 && bVar1,in_stack_ffffffffffffffd8));
      local_18 = msgbuf_00;
    }
  }
  return;
}

Assistant:

void
msgbuf_drain(struct msgbuf *msgbuf, size_t n)
{
	struct ibuf	*buf, *next;

	for (buf = TAILQ_FIRST(&msgbuf->bufs); buf != NULL && n > 0;
	    buf = next) {
		next = TAILQ_NEXT(buf, entry);
		if (buf->rpos + n >= buf->wpos) {
			n -= buf->wpos - buf->rpos;
			ibuf_dequeue(msgbuf, buf);
		} else {
			buf->rpos += n;
			n = 0;
		}
	}
}